

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

char * lyd_path(lyd_node *node,LYD_PATH_TYPE pathtype,char *buffer,size_t buflen)

{
  uint16_t uVar1;
  LY_ERR LVar2;
  int iVar3;
  lyd_node *node_00;
  lys_module *plVar4;
  size_t sVar5;
  char *pcVar6;
  lysc_node *local_c0;
  char *local_a8;
  size_t local_98;
  long local_88;
  ly_ctx *local_80;
  LY_ERR local_74;
  LY_ERR rc;
  lys_module *prev_mod;
  lys_module *mod;
  lyd_node *parent;
  lyd_node *iter;
  size_t len;
  size_t bufused;
  uint local_38;
  uint32_t depth;
  uint32_t i;
  ly_bool is_static;
  size_t buflen_local;
  char *buffer_local;
  lyd_node *plStack_18;
  LYD_PATH_TYPE pathtype_local;
  lyd_node *node_local;
  
  depth._3_1_ = '\0';
  len = 0;
  _i = buflen;
  buflen_local = (size_t)buffer;
  buffer_local._4_4_ = pathtype;
  plStack_18 = node;
  if (node == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_path");
    node_local = (lyd_node *)0x0;
  }
  else {
    if (buffer == (char *)0x0) {
      _i = 0;
    }
    else {
      if (buflen < 2) {
        if (node->schema == (lysc_node *)0x0) {
          local_80 = (ly_ctx *)node[2].schema;
        }
        else {
          local_80 = node->schema->module->ctx;
        }
        ly_log(local_80,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","buflen > 1","lyd_path");
        return (char *)0x0;
      }
      depth._3_1_ = '\x01';
    }
    if (pathtype < 2) {
      bufused._4_4_ = 1;
      for (parent = node; parent->parent != (lyd_node_inner *)0x0; parent = lyd_parent(parent)) {
        bufused._4_4_ = bufused._4_4_ + 1;
      }
      while( true ) {
        prev_mod = lyd_node_module(parent);
        node_00 = lyd_parent(parent);
        plVar4 = lyd_node_module(node_00);
        if (plVar4 == prev_mod) {
          prev_mod = (lys_module *)0x0;
        }
        if (prev_mod == (lys_module *)0x0) {
          local_88 = 0;
        }
        else {
          sVar5 = strlen(prev_mod->name);
          local_88 = sVar5 + 1;
        }
        if (parent->schema == (lysc_node *)0x0) {
          local_98 = strlen((char *)parent[1].schema);
        }
        else {
          local_98 = strlen(parent->schema->name);
        }
        LVar2 = lyd_path_str_enlarge
                          ((char **)&buflen_local,(size_t *)&i,len + local_88 + 1 + local_98,
                           depth._3_1_);
        if (LVar2 != LY_SUCCESS) break;
        if (prev_mod == (lys_module *)0x0) {
          local_a8 = "";
        }
        else {
          local_a8 = prev_mod->name;
        }
        pcVar6 = "";
        if (prev_mod != (lys_module *)0x0) {
          pcVar6 = ":";
        }
        if (parent->schema == (lysc_node *)0x0) {
          local_c0 = parent[1].schema;
        }
        else {
          local_c0 = (lysc_node *)parent->schema->name;
        }
        iVar3 = sprintf((char *)(buflen_local + len),"/%s%s%s",local_a8,pcVar6,local_c0);
        len = (long)iVar3 + len;
        local_74 = LY_SUCCESS;
        if ((parent->schema != (lysc_node *)0x0) &&
           ((1 < bufused._4_4_ || (buffer_local._4_4_ == LYD_PATH_STD)))) {
          uVar1 = parent->schema->nodetype;
          if (uVar1 == 8) {
            if ((parent->schema->flags & 1) == 0) {
              local_74 = lyd_path_position_predicate
                                   (parent,(char **)&buflen_local,(size_t *)&i,&len,depth._3_1_);
            }
            else {
              local_74 = lyd_path_leaflist_predicate
                                   (parent,(char **)&buflen_local,(size_t *)&i,&len,depth._3_1_);
            }
          }
          else if (uVar1 == 0x10) {
            if ((parent->schema->flags & 0x200) == 0) {
              local_74 = lyd_path_list_predicate
                                   (parent,(char **)&buflen_local,(size_t *)&i,&len,depth._3_1_);
            }
            else {
              local_74 = lyd_path_position_predicate
                                   (parent,(char **)&buflen_local,(size_t *)&i,&len,depth._3_1_);
            }
          }
        }
        if ((local_74 != LY_SUCCESS) || (bufused._4_4_ = bufused._4_4_ - 1, bufused._4_4_ == 0))
        break;
        parent = plStack_18;
        for (local_38 = 1; local_38 < bufused._4_4_; local_38 = local_38 + 1) {
          parent = lyd_parent(parent);
        }
      }
    }
    node_local = (lyd_node *)buflen_local;
  }
  return (char *)node_local;
}

Assistant:

LIBYANG_API_DEF char *
lyd_path(const struct lyd_node *node, LYD_PATH_TYPE pathtype, char *buffer, size_t buflen)
{
    ly_bool is_static = 0;
    uint32_t i, depth;
    size_t bufused = 0, len;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, node, NULL);
    if (buffer) {
        LY_CHECK_ARG_RET(LYD_CTX(node), buflen > 1, NULL);
        is_static = 1;
    } else {
        buflen = 0;
    }

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        depth = 1;
        for (iter = node; iter->parent; iter = lyd_parent(iter)) {
            ++depth;
        }

        goto iter_print;
        while (depth) {
            /* find the right node */
            for (iter = node, i = 1; i < depth; iter = lyd_parent(iter), ++i) {}
iter_print:
            /* get the module */
            mod = lyd_node_module(iter);
            parent = lyd_parent(iter);
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, is_static);
            if (rc != LY_SUCCESS) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, is_static);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc != LY_SUCCESS) {
                break;
            }

            --depth;
        }
        break;
    }

    return buffer;
}